

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

uint16_t ot::commissioner::GetSockPort(sockaddr_storage *aSockAddr)

{
  sockaddr_in6 *addr6;
  sockaddr_in *addr4;
  uint16_t port;
  sockaddr_storage *aSockAddr_local;
  
  if (aSockAddr->ss_family == 2) {
    addr4._6_2_ = ntohs(*(uint16_t *)aSockAddr->__ss_padding);
  }
  else {
    if (aSockAddr->ss_family != 10) {
      abort();
    }
    addr4._6_2_ = ntohs(*(uint16_t *)aSockAddr->__ss_padding);
  }
  return addr4._6_2_;
}

Assistant:

static uint16_t GetSockPort(const sockaddr_storage &aSockAddr)
{
    uint16_t port;

    if (aSockAddr.ss_family == AF_INET)
    {
        auto &addr4 = *reinterpret_cast<const sockaddr_in *>(&aSockAddr);
        ExitNow(port = ntohs(addr4.sin_port));
    }
    else if (aSockAddr.ss_family == AF_INET6)
    {
        auto &addr6 = *reinterpret_cast<const sockaddr_in6 *>(&aSockAddr);
        ExitNow(port = ntohs(addr6.sin6_port));
    }
    else
    {
        VerifyOrDie(false);
    }

exit:
    return port;
}